

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O1

int opn2_generateFormat(OPN2_MIDIPlayer *device,int sampleCount,OPN2_UInt8 *out_left,
                       OPN2_UInt8 *out_right,OPNMIDI_AudioFormat *format)

{
  int32_t *__s;
  unsigned_long uVar1;
  OPNMIDI_SampleType OVar2;
  OPNMIDIplay *this;
  OPN2 *pOVar3;
  OPNChipBase *pOVar4;
  long *plVar5;
  bool bVar6;
  OPN2_UInt8 OVar7;
  undefined2 uVar8;
  int iVar9;
  undefined4 uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  code *pcVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double s;
  
  uVar15 = sampleCount - (sampleCount >> 0x1f);
  uVar16 = uVar15 & 0xfffffffe;
  iVar9 = 0;
  if (device != (OPN2_MIDIPlayer *)0x0 && -1 < (int)uVar16) {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("player",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x4e8,
                    "int opn2_generateFormat(struct OPN2_MIDIPlayer *, int, OPN2_UInt8 *, OPN2_UInt8 *, const OPNMIDI_AudioFormat *)"
                   );
    }
    if (0 < (int)uVar16) {
      uVar1 = (this->m_setup).PCM_RATE;
      dVar22 = (double)(uVar15 >> 1) /
               (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      __s = this->m_outBuf;
      uVar14 = 0;
      uVar15 = uVar16;
      do {
        if (dVar22 <= 0.0) {
          uVar1 = (this->m_setup).PCM_RATE;
          dVar22 = (double)(uVar15 >> 1) /
                   (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        }
        dVar21 = (this->m_setup).maxdelay;
        s = dVar22;
        if (dVar21 <= dVar22) {
          s = dVar21;
        }
        uVar1 = (this->m_setup).PCM_RATE;
        dVar21 = (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * s +
                 (this->m_setup).carry;
        uVar11 = (ulong)dVar21;
        (this->m_setup).carry = dVar21 - (double)(long)uVar11;
        uVar19 = (ulong)(uVar15 >> 1);
        if ((long)uVar11 < (long)(ulong)(uVar15 >> 1)) {
          uVar19 = uVar11;
        }
        uVar11 = 0x200;
        if ((long)uVar19 < 0x200) {
          uVar11 = uVar19;
        }
        memset(__s,0,uVar11 * 8);
        pOVar3 = (this->m_synth).m_p;
        uVar13 = (ulong)pOVar3->m_numChips;
        if (uVar13 == 1) {
          pOVar4 = ((pOVar3->m_chips).
                    super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_p;
          (*pOVar4->_vptr_OPNChipBase[0x12])(pOVar4,__s,uVar11);
        }
        else if (uVar13 != 0) {
          lVar20 = 0;
          do {
            plVar5 = *(long **)((long)&((pOVar3->m_chips).
                                        super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar20);
            (**(code **)(*plVar5 + 0x98))(plVar5,__s,uVar11);
            lVar20 = lVar20 + 0x10;
          } while (uVar13 << 4 != lVar20);
        }
        uVar11 = uVar11 * 2;
        if (uVar19 != 0) {
          uVar13 = uVar16 - uVar14;
          uVar19 = uVar13;
          if (uVar11 < uVar13) {
            uVar19 = uVar11;
          }
          OVar2 = format->type;
          if (OPNMIDI_SampleType_U32 < OVar2) {
            return 0;
          }
          uVar12 = format->containerSize;
          uVar17 = (ulong)format->sampleOffset;
          lVar20 = (uVar14 >> 1) * uVar17;
          switch(OVar2) {
          default:
            if (uVar12 == 4) {
              if (1 < uVar19) {
                if (uVar11 < uVar13) {
                  uVar13 = uVar11;
                }
                uVar19 = 0;
                do {
                  *(int32_t *)(out_left + lVar20) = this->m_outBuf[uVar19 * 2];
                  *(int32_t *)(out_right + lVar20) = this->m_outBuf[uVar19 * 2 + 1];
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + uVar17;
                } while (uVar13 >> 1 != uVar19);
              }
            }
            else {
              if (uVar12 != 2) {
                return 0;
              }
              pcVar18 = opn2_cvtU16;
              if (OVar2 == OPNMIDI_SampleType_S16) {
                pcVar18 = opn2_cvtS16;
              }
              if (1 < uVar19) {
                if (uVar11 < uVar13) {
                  uVar13 = uVar11;
                }
                uVar19 = 0;
                do {
                  uVar8 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                  *(undefined2 *)(out_left + lVar20) = uVar8;
                  uVar8 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                  *(undefined2 *)(out_right + lVar20) = uVar8;
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + uVar17;
                } while (uVar13 >> 1 != uVar19);
              }
            }
            break;
          case OPNMIDI_SampleType_S8:
          case OPNMIDI_SampleType_U8:
            pcVar18 = opn2_cvtU8;
            if (OVar2 == OPNMIDI_SampleType_S8) {
              pcVar18 = opn2_cvtS8;
            }
            if (uVar12 == 4) {
              if (1 < uVar19) {
                if (uVar11 < uVar13) {
                  uVar13 = uVar11;
                }
                uVar19 = 0;
                do {
                  uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                  *(undefined4 *)(out_left + lVar20) = uVar10;
                  uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                  *(undefined4 *)(out_right + lVar20) = uVar10;
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + uVar17;
                } while (uVar13 >> 1 != uVar19);
              }
            }
            else if (uVar12 == 2) {
              if (1 < uVar19) {
                if (uVar11 < uVar13) {
                  uVar13 = uVar11;
                }
                uVar19 = 0;
                do {
                  uVar8 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                  *(undefined2 *)(out_left + lVar20) = uVar8;
                  uVar8 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                  *(undefined2 *)(out_right + lVar20) = uVar8;
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + uVar17;
                } while (uVar13 >> 1 != uVar19);
              }
            }
            else {
              if (uVar12 != 1) {
                return 0;
              }
              if (1 < uVar19) {
                if (uVar11 < uVar13) {
                  uVar13 = uVar11;
                }
                uVar19 = 0;
                do {
                  OVar7 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                  out_left[lVar20] = OVar7;
                  OVar7 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                  out_right[lVar20] = OVar7;
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + uVar17;
                } while (uVar13 >> 1 != uVar19);
              }
            }
            break;
          case OPNMIDI_SampleType_F32:
            if (uVar12 != 4) {
              return 0;
            }
            if (1 < uVar19) {
              if (uVar11 < uVar13) {
                uVar13 = uVar11;
              }
              uVar19 = 0;
              do {
                *(float *)(out_left + lVar20) = (float)this->m_outBuf[uVar19 * 2] * 3.051851e-05;
                *(float *)(out_right + lVar20) =
                     (float)this->m_outBuf[uVar19 * 2 + 1] * 3.051851e-05;
                uVar19 = uVar19 + 1;
                lVar20 = lVar20 + uVar17;
              } while (uVar13 >> 1 != uVar19);
            }
            break;
          case OPNMIDI_SampleType_F64:
            if (uVar12 != 8) {
              return 0;
            }
            if (1 < uVar19) {
              if (uVar11 < uVar13) {
                uVar13 = uVar11;
              }
              uVar19 = 0;
              do {
                *(double *)(out_left + lVar20) =
                     (double)this->m_outBuf[uVar19 * 2] * 3.051850947599719e-05;
                *(double *)(out_right + lVar20) =
                     (double)this->m_outBuf[uVar19 * 2 + 1] * 3.051850947599719e-05;
                uVar19 = uVar19 + 1;
                lVar20 = lVar20 + uVar17;
              } while (uVar13 >> 1 != uVar19);
            }
            break;
          case OPNMIDI_SampleType_S24:
          case OPNMIDI_SampleType_U24:
            if (uVar12 != 4) {
              return 0;
            }
            pcVar18 = opn2_cvtU24;
            if (OVar2 == OPNMIDI_SampleType_S24) {
              pcVar18 = opn2_cvtS24;
            }
            if (1 < uVar19) {
              if (uVar11 < uVar13) {
                uVar13 = uVar11;
              }
              uVar19 = 0;
              do {
                uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                *(undefined4 *)(out_left + lVar20) = uVar10;
                uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                *(undefined4 *)(out_right + lVar20) = uVar10;
                uVar19 = uVar19 + 1;
                lVar20 = lVar20 + uVar17;
              } while (uVar13 >> 1 != uVar19);
            }
            break;
          case OPNMIDI_SampleType_S32:
          case OPNMIDI_SampleType_U32:
            if (uVar12 != 4) {
              return 0;
            }
            pcVar18 = opn2_cvtU32;
            if (OVar2 == OPNMIDI_SampleType_S32) {
              pcVar18 = opn2_cvtS32;
            }
            if (1 < uVar19) {
              if (uVar11 < uVar13) {
                uVar13 = uVar11;
              }
              uVar19 = 0;
              do {
                uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2]);
                *(undefined4 *)(out_left + lVar20) = uVar10;
                uVar10 = (*pcVar18)(this->m_outBuf[uVar19 * 2 + 1]);
                *(undefined4 *)(out_right + lVar20) = uVar10;
                uVar19 = uVar19 + 1;
                lVar20 = lVar20 + uVar17;
              } while (uVar13 >> 1 != uVar19);
            }
          }
        }
        dVar22 = dVar22 - s;
        uVar14 = uVar14 + uVar11;
        OPNMIDIplay::TickIterators(this,s);
        uVar12 = uVar15 - (int)uVar11;
        bVar6 = (int)uVar11 <= (int)uVar15;
        uVar15 = uVar12;
      } while (uVar12 != 0 && bVar6);
      iVar9 = (int)uVar14;
    }
  }
  return iVar9;
}

Assistant:

OPNMIDI_EXPORT int opn2_generateFormat(struct OPN2_MIDIPlayer *device, int sampleCount,
                                       OPN2_UInt8 *out_left, OPN2_UInt8 *out_right,
                                       const OPNMIDI_AudioFormat *format)
{
    sampleCount -= sampleCount % 2; //Avoid even sample requests
    if(sampleCount < 0)
        return 0;
    if(!device)
        return 0;

    MidiPlayer *player = GET_MIDI_PLAYER(device);
    assert(player);
    MidiPlayer::Setup &setup = player->m_setup;

    ssize_t gotten_len = 0;
    ssize_t n_periodCountStereo = 512;

    int     left = sampleCount;
    double  delay = double(sampleCount / 2) / double(setup.PCM_RATE);

    while(left > 0)
    {
        if(delay <= 0.0)
            delay = double(left / 2) / double(setup.PCM_RATE);
        const double eat_delay = delay < setup.maxdelay ? delay : setup.maxdelay;
        delay -= eat_delay;
        setup.carry += double(setup.PCM_RATE) * eat_delay;
        n_periodCountStereo = static_cast<ssize_t>(setup.carry);
        setup.carry -= double(n_periodCountStereo);

        {
            ssize_t leftSamples = left / 2;
            if(n_periodCountStereo > leftSamples)
                n_periodCountStereo = leftSamples;
            //! Count of stereo samples
            ssize_t in_generatedStereo = (n_periodCountStereo > 512) ? 512 : n_periodCountStereo;
            //! Total count of samples
            ssize_t in_generatedPhys = in_generatedStereo * 2;
            //! Unsigned total sample count
            //fill buffer with zeros
            int32_t *out_buf = player->m_outBuf;
            std::memset(out_buf, 0, static_cast<size_t>(in_generatedPhys) * sizeof(out_buf[0]));
            Synth &synth = *player->m_synth;
            unsigned int chips = synth.m_numChips;
            if(chips == 1)
                synth.m_chips[0]->generate32(out_buf, (size_t)in_generatedStereo);
            else/* if(n_periodCountStereo > 0)*/
            {
                /* Generate data from every chip and mix result */
                for(size_t card = 0; card < chips; ++card)
                    synth.m_chips[card]->generateAndMix32(out_buf, (size_t)in_generatedStereo);
            }
            /* Process it */
            if(SendStereoAudio(sampleCount, in_generatedStereo, out_buf, gotten_len, out_left, out_right, format) == -1)
                return 0;

            left -= (int)in_generatedPhys;
            gotten_len += (in_generatedPhys) /* - setup.stored_samples*/;
        }

        player->TickIterators(eat_delay);
    }

    return static_cast<int>(gotten_len);
}